

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

ArenaDtorNeeds __thiscall
google::protobuf::compiler::cpp::MessageGenerator::NeedsArenaDestructor(MessageGenerator *this)

{
  bool bVar1;
  ArenaDtorNeeds AVar2;
  value_type_conflict field;
  FieldGenerator *pFVar3;
  ArenaDtorNeeds AVar4;
  Iterator __begin3;
  Iterator __end3;
  Iterator local_40;
  Iterator local_30;
  
  bVar1 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  AVar4 = kNone;
  if (!bVar1) {
    local_40.descriptor = this->descriptor_;
    local_40.idx = 0;
    local_30.idx = (local_40.descriptor)->field_count_;
    AVar4 = kNone;
    local_30.descriptor = local_40.descriptor;
    while( true ) {
      bVar1 = protobuf::internal::operator!=(&local_40,&local_30);
      if (!bVar1) break;
      field = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                        (&local_40);
      pFVar3 = FieldGeneratorTable::get(&this->field_generators_,field);
      AVar2 = (**(code **)((long)((pFVar3->impl_)._M_t.
                                  super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                                  .
                                  super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>
                                 ._M_head_impl)->_vptr_FieldGeneratorBase + 0xe8))();
      if ((int)AVar4 <= (int)AVar2) {
        AVar4 = AVar2;
      }
      local_40.idx = local_40.idx + 1;
    }
  }
  return AVar4;
}

Assistant:

ArenaDtorNeeds MessageGenerator::NeedsArenaDestructor() const {
  if (HasSimpleBaseClass(descriptor_, options_)) return ArenaDtorNeeds::kNone;
  ArenaDtorNeeds needs = ArenaDtorNeeds::kNone;
  for (const auto* field : FieldRange(descriptor_)) {
    needs =
        std::max(needs, field_generators_.get(field).NeedsArenaDestructor());
  }
  return needs;
}